

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputStream.cpp
# Opt level: O0

void __thiscall
supermap::io::FileOutputStream::FileOutputStream
          (FileOutputStream *this,string *filename,bool append)

{
  byte bVar1;
  undefined8 uVar2;
  byte in_DL;
  _Ios_Openmode _Var3;
  string *in_RSI;
  string *in_RDI;
  FileException *unaff_retaddr;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffffb7;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string *fileName;
  
  fileName = in_RDI;
  OutputStream::OutputStream((OutputStream *)in_RDI);
  *(undefined ***)in_RDI = &PTR_get_00120a38;
  std::__cxx11::string::string((string *)&in_RDI->_M_string_length,(string *)in_RSI);
  _Var3 = _S_out;
  if ((in_DL & 1) != 0) {
    _Var3 = _S_app;
  }
  std::ofstream::ofstream(&in_RDI[1]._M_string_length,(string *)in_RSI,_Var3);
  bVar1 = std::ios::good();
  if (((bVar1 & 1) != 0) && (bVar1 = std::ios::bad(), (bVar1 & 1) == 0)) {
    return;
  }
  uVar4 = 1;
  uVar2 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffffb7,CONCAT16(uVar4,in_stack_ffffffffffffffb0)));
  FileException::FileException(unaff_retaddr,fileName,in_RSI);
  __cxa_throw(uVar2,&FileException::typeinfo,FileException::~FileException);
}

Assistant:

FileOutputStream::FileOutputStream(const std::string &filename, bool append)
    : filename_(filename), ofs_(filename, append ? std::ios_base::app : std::ios_base::out) {
    if (!ofs_.good() || ofs_.bad()) {
        throw FileException(filename, "Unable to open for writing");
    }
}